

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_deduc.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  string _listinit_type;
  string _dbl_type;
  string _str_type;
  string _int_type;
  char *local_b0;
  char *local_a8;
  char local_a0;
  undefined7 uStack_9f;
  char *local_90;
  char *local_88;
  char local_80;
  undefined7 uStack_7f;
  char *local_70;
  char *local_68;
  char local_60;
  undefined7 uStack_5f;
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = '\0';
  local_68 = (char *)0x0;
  local_60 = '\0';
  local_88 = (char *)0x0;
  local_80 = '\0';
  local_a8 = (char *)0x0;
  local_a0 = '\0';
  local_b0 = &local_a0;
  local_90 = &local_80;
  local_70 = &local_60;
  local_50 = &local_40;
  iVar1 = strcmp(_put + (*_put == '*'),"i");
  pcVar3 = "int";
  pcVar4 = "unknown/non-gcc/clang compiler";
  if (iVar1 != 0) {
    pcVar3 = "unknown/non-gcc/clang compiler";
  }
  std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar3);
  iVar1 = strcmp(__Init + (*__Init == '*'),"d");
  pcVar3 = "double";
  if (iVar1 != 0) {
    pcVar3 = "unknown/non-gcc/clang compiler";
  }
  std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,(ulong)pcVar3);
  iVar1 = strcmp(_flush + (*_flush == '*'),"PKc");
  if (iVar1 == 0) {
    pcVar4 = "std::string";
  }
  std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,(ulong)pcVar4);
  std::__cxx11::string::_M_replace((ulong)&local_b0,0,local_a8,0x102042);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"_int\": ",8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is an ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"_dbl\": ",8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is an ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_90,(long)local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"_str\": ",8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is an ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_70,(long)local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"_listinit\": ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\"List\", \"Init\"}",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is an ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_b0,(long)local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return 0;
}

Assistant:

int main() {
	auto _int {9};
	auto _str {"Marc-Elie"};
	auto _dbl {23.5};
	//It's a shame std::initializer_list<> is not subscriptable :/
	auto _listinit = { "List", "Init"};
	std::string _int_type,_str_type,_dbl_type,_listinit_type;

	/* This solution is not portable across compilers--
		The result of std::type_info.name() is mangled
		on gcc and clang but IBM, Oracle, and MSVC
		provide human readable names. */

	if ( std::strcmp((typeid(_int).name()), "i") == 0 ) { _int_type = "int"; }
	else { _int_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_dbl).name()), "d") == 0 ) { _dbl_type = "double"; }
	else { _dbl_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_str).name()), "PKc") == 0 ) { _str_type = "std::string"; }
	else { _str_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_listinit).name()), "St16initializer_listIPKcE") == 0 ) 
		 { _listinit_type = "std::initializer_list<char const*>"; }
	else { _listinit_type = "unknown/non-gcc/clang compiler"; }

	//Print the values and their types
	std::cout << "\n"
		<<"\"_int\": " << _int << " is an " << _int_type << ".\n"
		<<"\"_dbl\": " << _int << " is an " << _dbl_type << ".\n"
		<<"\"_str\": " << _int << " is an " << _str_type << ".\n"
		<<"\"_listinit\": " << "{\"List\", \"Init\"}"<< " is an " << _listinit_type << ".\n"
		<<std::endl;
}